

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

bool __thiscall
Fossilize::DumbDirectoryDatabase::read_entry
          (DumbDirectoryDatabase *this,ResourceTag tag,Hash hash,size_t *blob_size,void *blob,
          PayloadReadFlags flags)

{
  bool bVar1;
  int iVar2;
  LogLevel LVar3;
  FILE *__stream;
  ulong __n;
  size_t sVar4;
  bool bVar5;
  char *__format;
  allocator local_99;
  string path;
  char filename [25];
  string local_50;
  
  if ((flags & 1) != 0) {
    return false;
  }
  if (this->mode != ReadOnly) {
    return false;
  }
  iVar2 = (*(this->super_DatabaseInterface)._vptr_DatabaseInterface[5])(this);
  if (blob_size == (size_t *)0x0) {
    return false;
  }
  if ((char)iVar2 == '\0') {
    return false;
  }
  sprintf(filename,"%02x.%016lx.json",(ulong)tag,hash);
  std::__cxx11::string::string((string *)&local_50,filename,&local_99);
  Path::join(&path,&this->base_directory,&local_50);
  std::__cxx11::string::_M_dispose();
  __stream = fopen(path._M_dataplus._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    LVar3 = get_thread_log_level();
    if ((int)LVar3 < 3) {
      bVar5 = false;
      bVar1 = Internal::log_thread_callback
                        (LOG_ERROR,"Failed to open file: %s\n",path._M_dataplus._M_p);
      if (bVar1) goto LAB_0016c58c;
      __format = "Fossilize ERROR: Failed to open file: %s\n";
LAB_0016c56f:
      bVar5 = false;
      fprintf(_stderr,__format,path._M_dataplus._M_p);
      goto LAB_0016c58c;
    }
  }
  else {
    iVar2 = fseek(__stream,0,2);
    if (iVar2 < 0) {
      fclose(__stream);
      LVar3 = get_thread_log_level();
      if ((int)LVar3 < 3) {
        bVar5 = false;
        bVar1 = Internal::log_thread_callback
                          (LOG_ERROR,"Failed to seek in file: %s\n",path._M_dataplus._M_p);
        if (bVar1) goto LAB_0016c58c;
        __format = "Fossilize ERROR: Failed to seek in file: %s\n";
        goto LAB_0016c56f;
      }
    }
    else {
      __n = ftell(__stream);
      rewind(__stream);
      if (blob == (void *)0x0) {
        *blob_size = __n;
LAB_0016c581:
        fclose(__stream);
        bVar5 = true;
        goto LAB_0016c58c;
      }
      if (__n <= *blob_size) {
        *blob_size = __n;
        sVar4 = fread(blob,1,__n,__stream);
        if (sVar4 == __n) goto LAB_0016c581;
      }
      fclose(__stream);
    }
  }
  bVar5 = false;
LAB_0016c58c:
  std::__cxx11::string::_M_dispose();
  return bVar5;
}

Assistant:

bool read_entry(ResourceTag tag, Hash hash, size_t *blob_size, void *blob, PayloadReadFlags flags) override
	{
		if ((flags & PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT) != 0)
			return false;

		if (mode != DatabaseMode::ReadOnly)
			return false;

		if (!has_entry(tag, hash))
			return false;

		if (!blob_size)
			return false;

		char filename[25]; // 2 digits + "." + 16 digits + ".json" + null
		sprintf(filename, "%02x.%016" PRIx64 ".json", static_cast<unsigned>(tag), hash);
		auto path = Path::join(base_directory, filename);

		FILE *file = fopen(path.c_str(), "rb");
		if (!file)
		{
			LOGE_LEVEL("Failed to open file: %s\n", path.c_str());
			return false;
		}

		if (fseek(file, 0, SEEK_END) < 0)
		{
			fclose(file);
			LOGE_LEVEL("Failed to seek in file: %s\n", path.c_str());
			return false;
		}

		size_t file_size = size_t(ftell(file));
		rewind(file);

		if (blob && *blob_size < file_size)
		{
			fclose(file);
			return false;
		}
		*blob_size = file_size;

		if (blob)
		{
			if (fread(blob, 1, file_size, file) != file_size)
			{
				fclose(file);
				return false;
			}
		}

		fclose(file);
		return true;
	}